

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O2

void __thiscall BPTree::removeInternal(BPTree *this,keys_struct *x,Node *cursor,Node *child)

{
  float fVar1;
  int iVar2;
  keys_struct *pkVar3;
  Node *pNVar4;
  uint uVar5;
  ostream *poVar6;
  Node *cursor_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong extraout_RDX;
  char *pcVar10;
  int iVar11;
  BPTree *pBVar12;
  Node **ppNVar13;
  ulong uVar14;
  ulong uVar15;
  pointer *pppvVar16;
  pointer ppvVar17;
  long lVar18;
  bool bVar19;
  keys_struct local_70;
  keys_struct local_50;
  
  uVar5 = cursor->size;
  if (uVar5 == 1 && this->root == cursor) {
    if (cursor->ptr[1] == child) {
      pkVar3 = child->key;
      if (pkVar3 != (keys_struct *)0x0) {
        ppvVar17 = pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (ppvVar17 != (pointer)0x0) {
          lVar7 = (long)ppvVar17 << 5;
          do {
            std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                      ((_Vector_base<void_*,_std::allocator<void_*>_> *)
                       ((long)pkVar3 + lVar7 + -0x18));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppvVar17 << 5 | 8
                         );
      }
      if (child->ptr != (Node **)0x0) {
        operator_delete__(child->ptr);
      }
      operator_delete(child,0x20);
      poVar6 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      std::operator<<(poVar6,"\n");
      ppNVar13 = cursor->ptr;
      this->root = *ppNVar13;
      pkVar3 = cursor->key;
      if (pkVar3 == (keys_struct *)0x0) {
LAB_0011a4c5:
        operator_delete__(ppNVar13);
      }
      else {
        pppvVar16 = &pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        ppvVar17 = pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (ppvVar17 != (pointer)0x0) {
          lVar7 = (long)ppvVar17 << 5;
          do {
            std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                      ((_Vector_base<void_*,_std::allocator<void_*>_> *)
                       ((long)pkVar3 + lVar7 + -0x18));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
LAB_0011a4a9:
        operator_delete__(pppvVar16,(long)ppvVar17 << 5 | 8);
        ppNVar13 = cursor->ptr;
        if (ppNVar13 != (Node **)0x0) goto LAB_0011a4c5;
      }
      operator_delete(cursor,0x20);
      poVar6 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      pcVar10 = "\n";
      goto LAB_0011a4ef;
    }
    if (*cursor->ptr == child) {
      pkVar3 = child->key;
      if (pkVar3 != (keys_struct *)0x0) {
        ppvVar17 = pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (ppvVar17 != (pointer)0x0) {
          lVar7 = (long)ppvVar17 << 5;
          do {
            std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                      ((_Vector_base<void_*,_std::allocator<void_*>_> *)
                       ((long)pkVar3 + lVar7 + -0x18));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppvVar17 << 5 | 8
                         );
      }
      if (child->ptr != (Node **)0x0) {
        operator_delete__(child->ptr);
      }
      operator_delete(child,0x20);
      poVar6 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      std::operator<<(poVar6,"\n");
      ppNVar13 = cursor->ptr;
      this->root = ppNVar13[1];
      pkVar3 = cursor->key;
      if (pkVar3 != (keys_struct *)0x0) {
        pppvVar16 = &pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
        ppvVar17 = pkVar3[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        if (ppvVar17 != (pointer)0x0) {
          lVar7 = (long)ppvVar17 << 5;
          do {
            std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                      ((_Vector_base<void_*,_std::allocator<void_*>_> *)
                       ((long)pkVar3 + lVar7 + -0x18));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        goto LAB_0011a4a9;
      }
      goto LAB_0011a4c5;
    }
    uVar5 = 1;
  }
  lVar7 = 0;
  uVar14 = 0;
  if (0 < (int)uVar5) {
    uVar14 = (ulong)uVar5;
  }
  for (uVar9 = 0; uVar15 = uVar14, uVar14 != uVar9; uVar9 = uVar9 + 1) {
    fVar1 = *(float *)((long)&cursor->key->key_value + lVar7);
    if ((fVar1 == x->key_value) && (uVar15 = uVar9, !NAN(fVar1) && !NAN(x->key_value))) break;
    lVar7 = lVar7 + 0x20;
  }
  lVar7 = uVar15 << 5;
  for (; lVar8 = (long)(int)uVar5, (long)uVar15 < lVar8; uVar15 = uVar15 + 1) {
    keys_struct::operator=
              ((keys_struct *)((long)&cursor->key->key_value + lVar7),
               (keys_struct *)((long)&cursor->key[1].key_value + lVar7));
    uVar5 = cursor->size;
    lVar7 = lVar7 + 0x20;
  }
  for (lVar7 = 0; (lVar7 <= lVar8 && (cursor->ptr[lVar7] != child)); lVar7 = lVar7 + 1) {
  }
  for (; lVar7 <= lVar8; lVar7 = lVar7 + 1) {
    cursor->ptr[lVar7] = cursor->ptr[lVar7 + 1];
  }
  cursor->size = uVar5 - 1;
  if ((int)uVar5 < 3) {
    if (this->root != cursor) {
      pBVar12 = this;
      cursor_00 = findParent(this,this->root,cursor);
      iVar11 = (int)pBVar12;
      iVar2 = cursor_00->size;
      ppNVar13 = cursor_00->ptr;
      lVar8 = 0;
      for (lVar7 = 0; lVar7 <= iVar2; lVar7 = lVar7 + 1) {
        if (ppNVar13[lVar7] == cursor) {
          uVar14 = lVar7 - 1;
          bVar19 = lVar8 != 0;
          if (bVar19) {
            uVar9 = uVar14 & 0xffffffff;
            pNVar4 = ppNVar13[uVar9];
            if (2 < pNVar4->size) {
              uVar14 = (ulong)(uint)cursor->size;
              lVar7 = uVar14 << 5;
              for (; 0 < (int)uVar14; uVar14 = (ulong)((int)uVar14 - 1)) {
                keys_struct::operator=
                          ((keys_struct *)((long)&cursor->key->key_value + lVar7),
                           (keys_struct *)((long)&cursor->key[-1].key_value + lVar7));
                lVar7 = lVar7 + -0x20;
              }
              keys_struct::operator=(cursor->key,cursor_00->key + uVar9);
              keys_struct::operator=(cursor_00->key + uVar9,pNVar4->key + (long)pNVar4->size + -1);
              uVar5 = cursor->size + 1;
              for (uVar14 = (ulong)uVar5; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
                cursor->ptr[uVar14] = cursor->ptr[uVar14 - 1];
              }
              *cursor->ptr = pNVar4->ptr[pNVar4->size];
              cursor->size = uVar5;
              pNVar4->size = pNVar4->size + -1;
              return;
            }
          }
          iVar11 = (int)lVar7 + 1;
          if ((int)lVar7 < iVar2) goto LAB_0011a530;
          goto LAB_0011a53e;
        }
        lVar8 = lVar8 + -0x20;
      }
      bVar19 = false;
      uVar14 = extraout_RDX;
LAB_0011a530:
      pNVar4 = ppNVar13[iVar11];
      if (pNVar4->size < 3) {
LAB_0011a53e:
        if (bVar19) {
          uVar14 = uVar14 & 0xffffffff;
          pNVar4 = ppNVar13[uVar14];
          keys_struct::operator=(pNVar4->key + pNVar4->size,cursor_00->key + uVar14);
          iVar11 = pNVar4->size;
          lVar8 = 0;
          lVar7 = 0;
          while( true ) {
            iVar2 = cursor->size;
            if (iVar2 <= lVar7) break;
            keys_struct::operator=
                      (pNVar4->key + (long)iVar11 + 1,
                       (keys_struct *)((long)&cursor->key->key_value + lVar8));
            lVar7 = lVar7 + 1;
            lVar8 = lVar8 + 0x20;
          }
          iVar11 = pNVar4->size;
          for (lVar7 = 0; lVar7 <= iVar2; lVar7 = lVar7 + 1) {
            pNVar4->ptr[(long)iVar11 + 1] = cursor->ptr[lVar7];
            cursor->ptr[lVar7] = (Node *)0x0;
          }
          pNVar4->size = iVar2 + iVar11 + 1;
          cursor->size = 0;
          keys_struct::keys_struct(&local_50,cursor_00->key + uVar14);
          removeInternal(this,&local_50,cursor_00,cursor);
          pkVar3 = &local_50;
        }
        else {
          if (iVar2 < iVar11) {
            return;
          }
          pNVar4 = ppNVar13[iVar11];
          lVar7 = (long)iVar11 + -1;
          keys_struct::operator=(cursor->key + cursor->size,cursor_00->key + lVar7);
          iVar11 = cursor->size;
          lVar18 = 0;
          lVar8 = 0;
          while( true ) {
            iVar2 = pNVar4->size;
            if (iVar2 <= lVar8) break;
            keys_struct::operator=
                      (cursor->key + (long)iVar11 + 1,
                       (keys_struct *)((long)&pNVar4->key->key_value + lVar18));
            lVar8 = lVar8 + 1;
            lVar18 = lVar18 + 0x20;
          }
          iVar11 = cursor->size;
          for (lVar8 = 0; lVar8 <= iVar2; lVar8 = lVar8 + 1) {
            cursor->ptr[(long)iVar11 + 1] = pNVar4->ptr[lVar8];
            pNVar4->ptr[lVar8] = (Node *)0x0;
          }
          cursor->size = iVar2 + iVar11 + 1;
          pNVar4->size = 0;
          keys_struct::keys_struct(&local_70,cursor_00->key + lVar7);
          removeInternal(this,&local_70,cursor_00,pNVar4);
          pkVar3 = &local_70;
        }
        std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                  (&(pkVar3->add_vect).super__Vector_base<void_*,_std::allocator<void_*>_>);
      }
      else {
        keys_struct::operator=
                  (cursor->key + cursor->size,(keys_struct *)((long)cursor_00->key - lVar8));
        keys_struct::operator=((keys_struct *)((long)cursor_00->key - lVar8),pNVar4->key);
        lVar7 = 0;
        for (lVar8 = 0; uVar5 = pNVar4->size, lVar8 < (long)(int)uVar5 + -1; lVar8 = lVar8 + 1) {
          keys_struct::operator=
                    ((keys_struct *)((long)&pNVar4->key->key_value + lVar7),
                     (keys_struct *)((long)&pNVar4->key[1].key_value + lVar7));
          lVar7 = lVar7 + 0x20;
        }
        iVar11 = cursor->size;
        cursor->ptr[(long)iVar11 + 1] = *pNVar4->ptr;
        uVar9 = 0;
        uVar14 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar14 = uVar9;
        }
        for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
          pNVar4->ptr[uVar9] = pNVar4->ptr[uVar9 + 1];
        }
        cursor->size = iVar11 + 1;
        pNVar4->size = pNVar4->size + -1;
      }
    }
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Deleted ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,x->key_value);
  poVar6 = std::operator<<(poVar6," ");
  pcVar10 = " from internal node successfully\n";
LAB_0011a4ef:
  std::operator<<(poVar6,pcVar10);
  return;
}

Assistant:

void removeInternal(keys_struct x, Node* cursor, Node* child)
    {
        //deleting the key x first
        //checking if key from root is to be deleted
        if(cursor == root)
        {
            if(cursor->size == 1)//if only one key is left, change root
            {
                if(cursor->ptr[1] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[0];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
                else if(cursor->ptr[0] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[1];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
            }
        }
        int pos;
        for(pos = 0; pos < cursor->size; pos++)
        {
            if(cursor->key[pos].key_value == x.key_value)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size; i++)
        {
            cursor->key[i] = cursor->key[i+1];
        }
        //now deleting the pointer child
        for(pos = 0; pos < cursor->size+1; pos++)
        {
            if(cursor->ptr[pos] == child)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size+1; i++)
        {
            cursor->ptr[i] = cursor->ptr[i+1];
        }
        cursor->size--;
        if(cursor->size >= (MAX+1)/2-1)//no underflow
        {
            cout<<"Deleted "<< x.key_value << " " <<" from internal node successfully\n";
            return;
        }
        //cout<<"Underflow in internal node!\n";
        //underflow, try to transfer first
        if(cursor==root)return;
        Node* parent = findParent(root, cursor);
        int leftSibling, rightSibling;
        //finding left n right sibling of cursor
        for(pos = 0; pos < parent->size+1; pos++)
        {
            if(parent->ptr[pos] == cursor)
            {
                leftSibling = pos - 1;
                rightSibling = pos + 1;
                break;
            }
        }
        //try to transfer
        if(leftSibling >= 0)//if left sibling exists
        {
            Node *leftNode = parent->ptr[leftSibling];
            //check if it is possible to transfer
            if(leftNode->size >= (MAX+1)/2)
            {
                //make space for transfer of key
                for(int i = cursor->size; i > 0; i--)
                {
                    cursor->key[i] = cursor->key[i-1];
                }
                //transfer key from left sibling through parent
                cursor->key[0] = parent->key[leftSibling];
                parent->key[leftSibling] = leftNode->key[leftNode->size-1];
                //transfer last pointer from leftnode to cursor
                //make space for transfer of ptr
                for (int i = cursor->size+1; i > 0; i--)
                {
                    cursor->ptr[i] = cursor->ptr[i-1];
                }
                //transfer ptr
                cursor->ptr[0] = leftNode->ptr[leftNode->size];
                cursor->size++;
                leftNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value<<" "<< x.add_vect[0] <<" from left sibling of internal node\n";
                return;
            }
        }
        if(rightSibling <= parent->size)//check if right sibling exist
        {
            Node *rightNode = parent->ptr[rightSibling];
            //check if it is possible to transfer
            if(rightNode->size >= (MAX+1)/2)
            {
                //transfer key from right sibling through parent
                cursor->key[cursor->size] = parent->key[pos];
                parent->key[pos] = rightNode->key[0];
                for (int i = 0; i < rightNode->size -1; i++)
                {
                    rightNode->key[i] = rightNode->key[i+1];
                }
                //transfer first pointer from rightnode to cursor
                //transfer ptr
                cursor->ptr[cursor->size+1] = rightNode->ptr[0];
                for (int i = 0; i < rightNode->size; ++i)
                {
                    rightNode->ptr[i] = rightNode->ptr[i+1];
                }
                cursor->size++;
                rightNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value << " " << x.add_vect[0] <<" from right sibling of internal node\n";
                return;
            }
        }
        //transfer wasnt posssible hence do merging
        if(leftSibling >= 0)
        {
            //leftnode + parent key + cursor
            Node *leftNode = parent->ptr[leftSibling];
            leftNode->key[leftNode->size] = parent->key[leftSibling];
            for(int i = leftNode->size+1, j = 0; j < cursor->size; j++)
            {
                leftNode->key[i] = cursor->key[j];
            }
            for(int i = leftNode->size+1, j = 0; j < cursor->size+1; j++)
            {
                leftNode->ptr[i] = cursor->ptr[j];
                cursor->ptr[j] = NULL;
            }
            leftNode->size += cursor->size+1;
            cursor->size = 0;
            //delete cursor
            removeInternal(parent->key[leftSibling], parent, cursor);
            //cout<<"Merged with left sibling\n";

        }
        else if(rightSibling <= parent->size)
        {
            //cursor + parent key + rightnode
            Node *rightNode = parent->ptr[rightSibling];
            cursor->key[cursor->size] = parent->key[rightSibling-1];
            for(int i = cursor->size+1, j = 0; j < rightNode->size; j++)
            {
                cursor->key[i] = rightNode->key[j];
            }
            for(int i = cursor->size+1, j = 0; j < rightNode->size+1; j++)
            {
                cursor->ptr[i] = rightNode->ptr[j];
                rightNode->ptr[j] = NULL;
            }
            cursor->size += rightNode->size+1;
            rightNode->size = 0;
            //delete cursor
            removeInternal(parent->key[rightSibling-1], parent, rightNode);
            //cout<<"Merged with right sibling\n";
        }
    }